

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O2

bool Diligent::AddObjectToArchive<Diligent::SerializedShaderImpl,Diligent::IShader>
               (IShader *pObject,char *ObjectTypeStr,INTERFACE_ID *SerializedObjIID,mutex *Mtx,
               unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>_>_>
               *Objects)

{
  Char *_Str;
  SerializedShaderImpl *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  char (*in_R9) [74];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>,_false,_false>,_bool>
  pVar4;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pSerializedObj;
  char *ObjectTypeStr_local;
  string msg;
  Char *Name;
  
  ObjectTypeStr_local = ObjectTypeStr;
  if (pObject == (IShader *)0x0) {
    FormatString<char_const*,char[18]>
              (&msg,(Diligent *)&ObjectTypeStr_local,(char **)0x70da3b,(char (*) [18])Mtx);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddObjectToArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x109);
    std::__cxx11::string::~string((string *)&msg);
    bVar3 = false;
  }
  else {
    RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
              (&pSerializedObj,(IObject *)pObject,SerializedObjIID);
    if (pSerializedObj.m_pObject == (SerializedShaderImpl *)0x0) {
      iVar2 = (*(pObject->super_IDeviceObject).super_IObject._vptr_IObject[4])(pObject);
      FormatString<char_const*,char[3],char_const*,char[45]>
                (&msg,(Diligent *)&ObjectTypeStr_local,(char **)0x6cec49,
                 (char (*) [3])CONCAT44(extraout_var,iVar2),
                 (char **)"\' was not created by a serialization device.",(char (*) [45])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"AddObjectToArchive",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
                 ,0x110);
      std::__cxx11::string::~string((string *)&msg);
      bVar3 = false;
    }
    else {
      _Str = ((pSerializedObj.m_pObject)->m_CreateInfo).m_CreateInfo.Desc.super_DeviceObjectAttribs.
             Name;
      Name = _Str;
      std::mutex::lock(Mtx);
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,_Str,true);
      pVar4 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<Diligent::HashMapStringKey,Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
                        ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)Objects,&msg,&pSerializedObj);
      HashMapStringKey::Clear((HashMapStringKey *)&msg);
      bVar3 = true;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this = *(SerializedShaderImpl **)
                ((long)pVar4.first.
                       super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>,_false>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>,_false>
                + 0x18);
        if (this != pSerializedObj.m_pObject) {
          bVar1 = SerializedShaderImpl::operator!=(this,pSerializedObj.m_pObject);
          if (bVar1) {
            FormatString<char_const*,char[13],char_const*,char[74]>
                      (&msg,(Diligent *)&ObjectTypeStr_local,(char **)0x6e23cf,(char (*) [13])&Name,
                       (char **)
                       "\' is already present in the archive. All objects must use distinct names.",
                       in_R9);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
            }
            std::__cxx11::string::~string((string *)&msg);
            bVar3 = false;
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)Mtx);
    }
    RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release(&pSerializedObj);
  }
  return bVar3;
}

Assistant:

bool AddObjectToArchive(IfaceType*                                                           pObject,
                        const char*                                                          ObjectTypeStr,
                        const INTERFACE_ID&                                                  SerializedObjIID,
                        std::mutex&                                                          Mtx,
                        std::unordered_map<HashMapStringKey, RefCntAutoPtr<ObjectImplType>>& Objects)
{
    DEV_CHECK_ERR(pObject != nullptr, ObjectTypeStr, " must not be null");
    if (pObject == nullptr)
        return false;

    RefCntAutoPtr<ObjectImplType> pSerializedObj{pObject, SerializedObjIID};
    if (!pSerializedObj)
    {
        UNEXPECTED(ObjectTypeStr, " '", pObject->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }
    const auto* Name = pSerializedObj->GetDesc().Name;

    std::lock_guard<std::mutex> Guard{Mtx};

    auto it_inserted = Objects.emplace(HashMapStringKey{Name, true}, pSerializedObj);
    if (!it_inserted.second && it_inserted.first->second != pSerializedObj)
    {
        if (*it_inserted.first->second != *pSerializedObj)
        {
            LOG_ERROR_MESSAGE(ObjectTypeStr, " with name '", Name, "' is already present in the archive. All objects must use distinct names.");
            return false;
        }
    }

    return true;
}